

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_custom_inplace(ggml_context *ctx,ggml_tensor *a,ggml_tensor **args,int n_args,
                   ggml_custom_op_t fun,int n_tasks,void *userdata)

{
  ggml_tensor *tensor;
  ulong uVar1;
  ulong uVar2;
  ggml_custom_op_params params;
  
  if (n_args < 9) {
    tensor = ggml_view_tensor(ctx,a);
    params.userdata = userdata;
    params.fun = fun;
    params.n_tasks = n_tasks;
    ggml_set_op_params(tensor,&params,0x18);
    tensor->op = GGML_OP_CUSTOM;
    tensor->src[0] = a;
    uVar1 = 0;
    uVar2 = (ulong)(uint)n_args;
    if (n_args < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      tensor->src[uVar1 + 1] = args[uVar1];
    }
    return tensor;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x13d2,
             "GGML_ASSERT(%s) failed","n_args < GGML_MAX_SRC - 1");
}

Assistant:

struct ggml_tensor * ggml_custom_inplace(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor ** args,
        int                   n_args,
        ggml_custom_op_t      fun,
        int                   n_tasks,
        void                * userdata) {

    GGML_ASSERT(n_args < GGML_MAX_SRC - 1);

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    struct ggml_custom_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op = GGML_OP_CUSTOM;
    result->src[0] = a;
    for (int i = 0; i < n_args; i++) {
        result->src[i + 1] = args[i];
    }

    return result;
}